

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlParseEntityDecl(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  xmlChar xVar2;
  int iVar3;
  xmlParserInputPtr pxVar4;
  entityDeclSAXFunc p_Var5;
  unparsedEntityDeclSAXFunc p_Var6;
  _xmlSAXHandler *p_Var7;
  int iVar8;
  xmlChar *pxVar9;
  xmlChar *pxVar10;
  xmlDocPtr pxVar11;
  xmlDtdPtr pxVar12;
  xmlChar *str;
  xmlChar *pxVar13;
  xmlEntityPtr pxVar14;
  xmlChar *orig;
  xmlChar *literal;
  xmlChar *local_40;
  xmlChar *local_38;
  
  local_38 = (xmlChar *)0x0;
  local_40 = (xmlChar *)0x0;
  pxVar4 = ctxt->input;
  pxVar9 = pxVar4->cur;
  if (*pxVar9 != '<') {
    return;
  }
  if (pxVar9[1] != '!') {
    return;
  }
  pxVar4->cur = pxVar9 + 2;
  pxVar4->col = pxVar4->col + 2;
  if (pxVar9[2] == '\0') {
    xmlParserGrow(ctxt);
  }
  pxVar4 = ctxt->input;
  pxVar9 = pxVar4->cur;
  if (*pxVar9 != 'E') {
    return;
  }
  if (pxVar9[1] != 'N') {
    return;
  }
  if (pxVar9[2] != 'T') {
    return;
  }
  if (pxVar9[3] != 'I') {
    return;
  }
  if (pxVar9[4] != 'T') {
    return;
  }
  if (pxVar9[5] != 'Y') {
    return;
  }
  iVar3 = pxVar4->id;
  pxVar4->cur = pxVar9 + 6;
  pxVar4->col = pxVar4->col + 6;
  if (pxVar9[6] == '\0') {
    xmlParserGrow(ctxt);
  }
  iVar8 = xmlSkipBlankCharsPE(ctxt);
  if (iVar8 == 0) {
    xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_SPACE_REQUIRED,XML_ERR_FATAL,
               (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
               "Space required after \'<!ENTITY\'\n");
  }
  xVar1 = *ctxt->input->cur;
  if (xVar1 == '%') {
    xmlNextChar(ctxt);
    iVar8 = xmlSkipBlankCharsPE(ctxt);
    if (iVar8 == 0) {
      xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_SPACE_REQUIRED,XML_ERR_FATAL,
                 (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s","Space required after \'%%\'\n"
                );
    }
  }
  pxVar9 = xmlParseName(ctxt);
  if (pxVar9 == (xmlChar *)0x0) {
    xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_NAME_REQUIRED,XML_ERR_FATAL,
               (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s","xmlParseEntityDecl: no name\n");
    return;
  }
  pxVar10 = xmlStrchr(pxVar9,':');
  if (pxVar10 != (xmlChar *)0x0) {
    ctxt->nsWellFormed = 0;
    xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_NAMESPACE,XML_NS_ERR_COLON,XML_ERR_ERROR,pxVar9,
               (xmlChar *)0x0,(xmlChar *)0x0,0,"colons are forbidden from entities names \'%s\'\n",
               pxVar9,0,0);
  }
  iVar8 = xmlSkipBlankCharsPE(ctxt);
  if (iVar8 == 0) {
    xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_SPACE_REQUIRED,XML_ERR_FATAL,
               (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
               "Space required after the entity name\n");
  }
  xVar2 = *ctxt->input->cur;
  if (xVar1 == '%') {
    if ((xVar2 != '\'') && (xVar2 != '\"')) {
      str = xmlParseExternalID(ctxt,&local_38,1);
      pxVar10 = local_38;
      if (str == (xmlChar *)0x0 && local_38 == (xmlChar *)0x0) {
        xmlFatalErr(ctxt,XML_ERR_VALUE_REQUIRED,(char *)0x0);
      }
      if (str == (xmlChar *)0x0) {
        str = (xmlChar *)0x0;
      }
      else {
        pxVar13 = xmlStrchr(str,'#');
        if (pxVar13 == (xmlChar *)0x0) {
          if (((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) &&
             (p_Var5 = ctxt->sax->entityDecl, p_Var5 != (entityDeclSAXFunc)0x0)) {
            (*p_Var5)(ctxt->userData,pxVar9,5,pxVar10,str,(xmlChar *)0x0);
          }
        }
        else {
          xmlFatalErr(ctxt,XML_ERR_URI_FRAGMENT,(char *)0x0);
        }
      }
      goto LAB_001377db;
    }
    pxVar10 = xmlParseEntityValue(ctxt,&local_40);
    if (pxVar10 == (xmlChar *)0x0) {
      pxVar10 = (xmlChar *)0x0;
    }
    else if (((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) &&
            (p_Var5 = ctxt->sax->entityDecl, p_Var5 != (entityDeclSAXFunc)0x0)) {
      str = (xmlChar *)0x0;
      (*p_Var5)(ctxt->userData,pxVar9,4,(xmlChar *)0x0,(xmlChar *)0x0,pxVar10);
      goto LAB_001377e0;
    }
LAB_001377a6:
    str = (xmlChar *)0x0;
  }
  else if ((xVar2 == '\'') || (xVar2 == '\"')) {
    pxVar10 = xmlParseEntityValue(ctxt,&local_40);
    if (((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) &&
       (p_Var5 = ctxt->sax->entityDecl, p_Var5 != (entityDeclSAXFunc)0x0)) {
      (*p_Var5)(ctxt->userData,pxVar9,1,(xmlChar *)0x0,(xmlChar *)0x0,pxVar10);
    }
    if ((ctxt->myDoc != (xmlDocPtr)0x0) &&
       (iVar8 = xmlStrEqual(ctxt->myDoc->version,(xmlChar *)"SAX compatibility mode document"),
       iVar8 == 0)) goto LAB_001377a6;
    if (ctxt->myDoc == (xmlDocPtr)0x0) {
      pxVar11 = xmlNewDoc((xmlChar *)"SAX compatibility mode document");
      ctxt->myDoc = pxVar11;
      if (pxVar11 != (xmlDocPtr)0x0) {
        pxVar11->properties = 0x40;
        goto LAB_00137477;
      }
LAB_001377ab:
      xmlCtxtErrMemory(ctxt);
      str = (xmlChar *)0x0;
      goto LAB_00137905;
    }
LAB_00137477:
    if (ctxt->myDoc->intSubset == (_xmlDtd *)0x0) {
      pxVar12 = xmlNewDtd(ctxt->myDoc,(xmlChar *)"fake",(xmlChar *)0x0,(xmlChar *)0x0);
      ctxt->myDoc->intSubset = pxVar12;
      if (pxVar12 == (xmlDtdPtr)0x0) goto LAB_001377ab;
    }
    str = (xmlChar *)0x0;
    xmlSAX2EntityDecl(ctxt,pxVar9,1,(xmlChar *)0x0,(xmlChar *)0x0,pxVar10);
  }
  else {
    str = xmlParseExternalID(ctxt,&local_38,1);
    pxVar10 = local_38;
    if (str == (xmlChar *)0x0 && local_38 == (xmlChar *)0x0) {
      xmlFatalErr(ctxt,XML_ERR_VALUE_REQUIRED,(char *)0x0);
    }
    if ((str != (xmlChar *)0x0) && (pxVar13 = xmlStrchr(str,'#'), pxVar13 != (xmlChar *)0x0)) {
      xmlFatalErr(ctxt,XML_ERR_URI_FRAGMENT,(char *)0x0);
    }
    if ((*ctxt->input->cur != '>') && (iVar8 = xmlSkipBlankCharsPE(ctxt), iVar8 == 0)) {
      xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_SPACE_REQUIRED,XML_ERR_FATAL,
                 (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
                 "Space required before \'NDATA\'\n");
    }
    pxVar4 = ctxt->input;
    pxVar13 = pxVar4->cur;
    if ((((*pxVar13 == 'N') && (pxVar13[1] == 'D')) && (pxVar13[2] == 'A')) &&
       ((pxVar13[3] == 'T' && (pxVar13[4] == 'A')))) {
      pxVar4->cur = pxVar13 + 5;
      pxVar4->col = pxVar4->col + 5;
      if (pxVar13[5] == '\0') {
        xmlParserGrow(ctxt);
      }
      iVar8 = xmlSkipBlankCharsPE(ctxt);
      if (iVar8 == 0) {
        xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_SPACE_REQUIRED,XML_ERR_FATAL,
                   (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
                   "Space required after \'NDATA\'\n");
      }
      pxVar13 = xmlParseName(ctxt);
      if (((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) &&
         (p_Var6 = ctxt->sax->unparsedEntityDecl, p_Var6 != (unparsedEntityDeclSAXFunc)0x0)) {
        (*p_Var6)(ctxt->userData,pxVar9,pxVar10,str,pxVar13);
      }
    }
    else {
      if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
         ((ctxt->disableSAX == 0 &&
          (p_Var5 = ctxt->sax->entityDecl, p_Var5 != (entityDeclSAXFunc)0x0)))) {
        (*p_Var5)(ctxt->userData,pxVar9,2,pxVar10,str,(xmlChar *)0x0);
      }
      if ((ctxt->replaceEntities != 0) &&
         ((ctxt->myDoc == (xmlDocPtr)0x0 ||
          (iVar8 = xmlStrEqual(ctxt->myDoc->version,(xmlChar *)"SAX compatibility mode document"),
          iVar8 != 0)))) {
        if (ctxt->myDoc == (xmlDocPtr)0x0) {
          pxVar11 = xmlNewDoc((xmlChar *)"SAX compatibility mode document");
          ctxt->myDoc = pxVar11;
          if (pxVar11 != (xmlDocPtr)0x0) {
            pxVar11->properties = 0x40;
            goto LAB_00137759;
          }
LAB_0013796c:
          xmlCtxtErrMemory(ctxt);
          pxVar10 = (xmlChar *)0x0;
          goto LAB_00137905;
        }
LAB_00137759:
        if (ctxt->myDoc->intSubset == (_xmlDtd *)0x0) {
          pxVar12 = xmlNewDtd(ctxt->myDoc,(xmlChar *)"fake",(xmlChar *)0x0,(xmlChar *)0x0);
          ctxt->myDoc->intSubset = pxVar12;
          if (pxVar12 == (xmlDtdPtr)0x0) goto LAB_0013796c;
        }
        xmlSAX2EntityDecl(ctxt,pxVar9,2,pxVar10,str,(xmlChar *)0x0);
      }
    }
LAB_001377db:
    pxVar10 = (xmlChar *)0x0;
  }
LAB_001377e0:
  xmlSkipBlankCharsPE(ctxt);
  if (*ctxt->input->cur == '>') {
    if (iVar3 != ctxt->input->id) {
      xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_ENTITY_BOUNDARY,XML_ERR_FATAL,
                 (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
                 "Entity declaration doesn\'t start and stop in the same entity\n");
    }
    xmlNextChar(ctxt);
  }
  else {
    xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_ENTITY_NOT_FINISHED,XML_ERR_FATAL,pxVar9
               ,(xmlChar *)0x0,(xmlChar *)0x0,0,"xmlParseEntityDecl: entity %s not terminated\n",
               pxVar9);
    xmlHaltParser(ctxt);
  }
  if (local_40 == (xmlChar *)0x0) goto LAB_00137905;
  p_Var7 = ctxt->sax;
  if (xVar1 == '%') {
    if ((p_Var7 == (_xmlSAXHandler *)0x0) ||
       (p_Var7->getParameterEntity == (getParameterEntitySAXFunc)0x0)) {
LAB_001378e5:
      pxVar14 = (xmlEntityPtr)0x0;
    }
    else {
      pxVar14 = (*p_Var7->getParameterEntity)(ctxt->userData,pxVar9);
    }
  }
  else {
    if ((p_Var7 == (_xmlSAXHandler *)0x0) || (p_Var7->getEntity == (getEntitySAXFunc)0x0)) {
      pxVar14 = (xmlEntityPtr)0x0;
    }
    else {
      pxVar14 = (*p_Var7->getEntity)(ctxt->userData,pxVar9);
    }
    if (pxVar14 == (xmlEntityPtr)0x0) {
      if ((xmlParserCtxtPtr)ctxt->userData != ctxt) goto LAB_001378e5;
      pxVar14 = xmlSAX2GetEntity(ctxt,pxVar9);
    }
  }
  if ((pxVar14 != (xmlEntityPtr)0x0) && (pxVar14->orig == (xmlChar *)0x0)) {
    pxVar14->orig = local_40;
    local_40 = (xmlChar *)0x0;
  }
LAB_00137905:
  if (pxVar10 != (xmlChar *)0x0) {
    (*xmlFree)(pxVar10);
  }
  if (str != (xmlChar *)0x0) {
    (*xmlFree)(str);
  }
  if (local_38 != (xmlChar *)0x0) {
    (*xmlFree)(local_38);
  }
  if (local_40 != (xmlChar *)0x0) {
    (*xmlFree)(local_40);
  }
  return;
}

Assistant:

void
xmlParseEntityDecl(xmlParserCtxtPtr ctxt) {
    const xmlChar *name = NULL;
    xmlChar *value = NULL;
    xmlChar *URI = NULL, *literal = NULL;
    const xmlChar *ndata = NULL;
    int isParameter = 0;
    xmlChar *orig = NULL;

    if ((CUR != '<') || (NXT(1) != '!'))
        return;
    SKIP(2);

    /* GROW; done in the caller */
    if (CMP6(CUR_PTR, 'E', 'N', 'T', 'I', 'T', 'Y')) {
	int inputid = ctxt->input->id;
	SKIP(6);
	if (SKIP_BLANKS_PE == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			   "Space required after '<!ENTITY'\n");
	}

	if (RAW == '%') {
	    NEXT;
	    if (SKIP_BLANKS_PE == 0) {
		xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			       "Space required after '%%'\n");
	    }
	    isParameter = 1;
	}

        name = xmlParseName(ctxt);
	if (name == NULL) {
	    xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
	                   "xmlParseEntityDecl: no name\n");
            return;
	}
	if (xmlStrchr(name, ':') != NULL) {
	    xmlNsErr(ctxt, XML_NS_ERR_COLON,
		     "colons are forbidden from entities names '%s'\n",
		     name, NULL, NULL);
	}
	if (SKIP_BLANKS_PE == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			   "Space required after the entity name\n");
	}

	/*
	 * handle the various case of definitions...
	 */
	if (isParameter) {
	    if ((RAW == '"') || (RAW == '\'')) {
	        value = xmlParseEntityValue(ctxt, &orig);
		if (value) {
		    if ((ctxt->sax != NULL) &&
			(!ctxt->disableSAX) && (ctxt->sax->entityDecl != NULL))
			ctxt->sax->entityDecl(ctxt->userData, name,
		                    XML_INTERNAL_PARAMETER_ENTITY,
				    NULL, NULL, value);
		}
	    } else {
	        URI = xmlParseExternalID(ctxt, &literal, 1);
		if ((URI == NULL) && (literal == NULL)) {
		    xmlFatalErr(ctxt, XML_ERR_VALUE_REQUIRED, NULL);
		}
		if (URI) {
                    if (xmlStrchr(URI, '#')) {
                        xmlFatalErr(ctxt, XML_ERR_URI_FRAGMENT, NULL);
                    } else {
                        if ((ctxt->sax != NULL) &&
                            (!ctxt->disableSAX) &&
                            (ctxt->sax->entityDecl != NULL))
                            ctxt->sax->entityDecl(ctxt->userData, name,
                                        XML_EXTERNAL_PARAMETER_ENTITY,
                                        literal, URI, NULL);
                    }
		}
	    }
	} else {
	    if ((RAW == '"') || (RAW == '\'')) {
	        value = xmlParseEntityValue(ctxt, &orig);
		if ((ctxt->sax != NULL) &&
		    (!ctxt->disableSAX) && (ctxt->sax->entityDecl != NULL))
		    ctxt->sax->entityDecl(ctxt->userData, name,
				XML_INTERNAL_GENERAL_ENTITY,
				NULL, NULL, value);
		/*
		 * For expat compatibility in SAX mode.
		 */
		if ((ctxt->myDoc == NULL) ||
		    (xmlStrEqual(ctxt->myDoc->version, SAX_COMPAT_MODE))) {
		    if (ctxt->myDoc == NULL) {
			ctxt->myDoc = xmlNewDoc(SAX_COMPAT_MODE);
			if (ctxt->myDoc == NULL) {
			    xmlErrMemory(ctxt);
			    goto done;
			}
			ctxt->myDoc->properties = XML_DOC_INTERNAL;
		    }
		    if (ctxt->myDoc->intSubset == NULL) {
			ctxt->myDoc->intSubset = xmlNewDtd(ctxt->myDoc,
					    BAD_CAST "fake", NULL, NULL);
                        if (ctxt->myDoc->intSubset == NULL) {
                            xmlErrMemory(ctxt);
                            goto done;
                        }
                    }

		    xmlSAX2EntityDecl(ctxt, name, XML_INTERNAL_GENERAL_ENTITY,
			              NULL, NULL, value);
		}
	    } else {
	        URI = xmlParseExternalID(ctxt, &literal, 1);
		if ((URI == NULL) && (literal == NULL)) {
		    xmlFatalErr(ctxt, XML_ERR_VALUE_REQUIRED, NULL);
		}
		if (URI) {
                    if (xmlStrchr(URI, '#')) {
                        xmlFatalErr(ctxt, XML_ERR_URI_FRAGMENT, NULL);
                    }
		}
		if ((RAW != '>') && (SKIP_BLANKS_PE == 0)) {
		    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
				   "Space required before 'NDATA'\n");
		}
		if (CMP5(CUR_PTR, 'N', 'D', 'A', 'T', 'A')) {
		    SKIP(5);
		    if (SKIP_BLANKS_PE == 0) {
			xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
				       "Space required after 'NDATA'\n");
		    }
		    ndata = xmlParseName(ctxt);
		    if ((ctxt->sax != NULL) && (!ctxt->disableSAX) &&
		        (ctxt->sax->unparsedEntityDecl != NULL))
			ctxt->sax->unparsedEntityDecl(ctxt->userData, name,
				    literal, URI, ndata);
		} else {
		    if ((ctxt->sax != NULL) &&
		        (!ctxt->disableSAX) && (ctxt->sax->entityDecl != NULL))
			ctxt->sax->entityDecl(ctxt->userData, name,
				    XML_EXTERNAL_GENERAL_PARSED_ENTITY,
				    literal, URI, NULL);
		    /*
		     * For expat compatibility in SAX mode.
		     * assuming the entity replacement was asked for
		     */
		    if ((ctxt->replaceEntities != 0) &&
			((ctxt->myDoc == NULL) ||
			(xmlStrEqual(ctxt->myDoc->version, SAX_COMPAT_MODE)))) {
			if (ctxt->myDoc == NULL) {
			    ctxt->myDoc = xmlNewDoc(SAX_COMPAT_MODE);
			    if (ctxt->myDoc == NULL) {
			        xmlErrMemory(ctxt);
				goto done;
			    }
			    ctxt->myDoc->properties = XML_DOC_INTERNAL;
			}

			if (ctxt->myDoc->intSubset == NULL) {
			    ctxt->myDoc->intSubset = xmlNewDtd(ctxt->myDoc,
						BAD_CAST "fake", NULL, NULL);
                            if (ctxt->myDoc->intSubset == NULL) {
                                xmlErrMemory(ctxt);
                                goto done;
                            }
                        }
			xmlSAX2EntityDecl(ctxt, name,
				          XML_EXTERNAL_GENERAL_PARSED_ENTITY,
				          literal, URI, NULL);
		    }
		}
	    }
	}
	SKIP_BLANKS_PE;
	if (RAW != '>') {
	    xmlFatalErrMsgStr(ctxt, XML_ERR_ENTITY_NOT_FINISHED,
	            "xmlParseEntityDecl: entity %s not terminated\n", name);
	    xmlHaltParser(ctxt);
	} else {
	    if (inputid != ctxt->input->id) {
		xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
	                       "Entity declaration doesn't start and stop in"
                               " the same entity\n");
	    }
	    NEXT;
	}
	if (orig != NULL) {
	    /*
	     * Ugly mechanism to save the raw entity value.
	     */
	    xmlEntityPtr cur = NULL;

	    if (isParameter) {
	        if ((ctxt->sax != NULL) &&
		    (ctxt->sax->getParameterEntity != NULL))
		    cur = ctxt->sax->getParameterEntity(ctxt->userData, name);
	    } else {
	        if ((ctxt->sax != NULL) &&
		    (ctxt->sax->getEntity != NULL))
		    cur = ctxt->sax->getEntity(ctxt->userData, name);
		if ((cur == NULL) && (ctxt->userData==ctxt)) {
		    cur = xmlSAX2GetEntity(ctxt, name);
		}
	    }
            if ((cur != NULL) && (cur->orig == NULL)) {
		cur->orig = orig;
                orig = NULL;
	    }
	}

done:
	if (value != NULL) xmlFree(value);
	if (URI != NULL) xmlFree(URI);
	if (literal != NULL) xmlFree(literal);
        if (orig != NULL) xmlFree(orig);
    }
}